

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syserror.cpp
# Opt level: O0

string * SysErrorString_abi_cxx11_(int err)

{
  long lVar1;
  char *pcVar2;
  int in_ESI;
  string *in_RDI;
  long in_FS_OFFSET;
  char *s;
  char buf [1024];
  undefined4 in_stack_fffffffffffffbf0;
  int *in_stack_fffffffffffffbf8;
  char **in_stack_fffffffffffffc00;
  char *in_stack_fffffffffffffc08;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = strerror_r(in_ESI,&stack0xfffffffffffffbf8,0x400);
  if (pcVar2 == (char *)0x0) {
    tinyformat::format<int>
              ((char *)in_stack_fffffffffffffbf8,(int *)CONCAT44(in_ESI,in_stack_fffffffffffffbf0));
  }
  else {
    tinyformat::format<char_const*,int>
              (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string SysErrorString(int err)
{
    char buf[1024];
    /* Too bad there are three incompatible implementations of the
     * thread-safe strerror. */
    const char *s = nullptr;
#ifdef WIN32
    if (strerror_s(buf, sizeof(buf), err) == 0) s = buf;
#else
#ifdef STRERROR_R_CHAR_P /* GNU variant can return a pointer outside the passed buffer */
    s = strerror_r(err, buf, sizeof(buf));
#else /* POSIX variant always returns message in buffer */
    if (strerror_r(err, buf, sizeof(buf)) == 0) s = buf;
#endif
#endif
    if (s != nullptr) {
        return strprintf("%s (%d)", s, err);
    } else {
        return strprintf("Unknown error (%d)", err);
    }
}